

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluCallLogWrapper.cpp
# Opt level: O1

ostream * __thiscall glu::operator<<(glu *this,ostream *str,FboParamPtrFmt fmt)

{
  ostream *poVar1;
  uint *puVar2;
  int iVar3;
  Enum<int,_2UL> local_18;
  
  puVar2 = fmt._0_8_;
  if (puVar2 == (uint *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"(null)",6);
    return (ostream *)this;
  }
  iVar3 = (int)str;
  if (iVar3 < 0x8cd0) {
    if (iVar3 - 0x8212U < 6) {
switchD_0051ed8f_caseD_8cd1:
      poVar1 = (ostream *)std::ostream::operator<<(this,*puVar2);
      return poVar1;
    }
    if (iVar3 == 0x8210) {
      local_18.m_value = *puVar2;
      local_18.m_getName = getFramebufferColorEncodingName;
    }
    else {
      if (iVar3 != 0x8211) goto LAB_0051edef;
      local_18.m_value = *puVar2;
      local_18.m_getName = getTypeName;
    }
  }
  else {
    switch(iVar3) {
    case 0x8cd0:
      local_18.m_value = *puVar2;
      local_18.m_getName = getFramebufferAttachmentTypeName;
      break;
    case 0x8cd1:
    case 0x8cd2:
    case 0x8cd4:
      goto switchD_0051ed8f_caseD_8cd1;
    case 0x8cd3:
      local_18.m_value = *puVar2;
      local_18.m_getName = getCubeMapFaceName;
      break;
    default:
      if (iVar3 != 0x8da7) {
LAB_0051edef:
        local_18.m_getName = (GetNameFunc)(ulong)*puVar2;
        poVar1 = tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_18,(ostream *)this);
        return poVar1;
      }
      local_18.m_value = *puVar2;
      local_18.m_getName = getBooleanName;
    }
  }
  poVar1 = tcu::Format::Enum<int,_2UL>::toStream(&local_18,(ostream *)this);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, FboParamPtrFmt fmt)
{
	if (fmt.value)
	{
		switch (fmt.param)
		{
			case GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE:
				return str << tcu::Format::Enum<int, 2>(getFramebufferAttachmentTypeName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE:
				return str << tcu::Format::Enum<int, 2>(getCubeMapFaceName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE:
				return str << tcu::Format::Enum<int, 2>(getTypeName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING:
				return str << tcu::Format::Enum<int, 2>(getFramebufferColorEncodingName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_LAYERED:
				return str << tcu::Format::Enum<int, 2>(getBooleanName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME:
			case GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER:
			case GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL:
			case GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE:
				return str << *fmt.value;

			default:
				return str << tcu::toHex(*fmt.value);
		}
	}
	else
		return str << "(null)";
}